

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rectangle.h
# Opt level: O0

rectangle * dlib::move_rect(rectangle *rect,long x,long y)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  long in_RCX;
  long in_RDX;
  rectangle *in_RDI;
  rectangle *in_stack_ffffffffffffffa8;
  
  uVar1 = rectangle::width(in_stack_ffffffffffffffa8);
  uVar2 = rectangle::height(in_stack_ffffffffffffffa8);
  rectangle::rectangle(in_RDI,in_RDX,in_RCX,in_RDX + uVar1 + -1,in_RCX + uVar2 + -1);
  return in_RDI;
}

Assistant:

inline const rectangle move_rect (
        const rectangle& rect,
        long x,
        long y 
    )
    {
        return rectangle(x, y, x+rect.width()-1, y+rect.height()-1);
    }